

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall GEO::geofile::simplify_plane_surfaces(geofile *this)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  iterator __x;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> local_190;
  _Base_ptr local_160;
  _Base_ptr local_158;
  undefined1 local_150;
  _Self local_148;
  iterator pl_sur_it_1;
  int local_11c;
  _Base_ptr p_Stack_118;
  int i_1;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_110;
  _Rb_tree_iterator<std::pair<const_int,_int>_> look_ahead;
  iterator pl_sur_it;
  _Self local_f8;
  _Rb_tree_iterator<std::pair<const_int,_int>_> plane_surface_it_end;
  value_type_conflict1 local_cc;
  ulong local_c8;
  size_t i;
  int local_b4;
  iterator iStack_b0;
  int total_pre_gaps;
  undefined1 local_a8 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> changes;
  set<int,_std::less<int>,_std::allocator<int>_> numbers;
  set<int,_std::less<int>,_std::allocator<int>_> gaps;
  geofile *this_local;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &numbers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &changes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_a8)
  ;
  iStack_b0 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                        (&this->plane_surfaces_map);
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&stack0xffffffffffffff50);
  if (1 < ppVar3->first) {
    i = (size_t)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                begin(&this->plane_surfaces_map);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&i);
    local_b4 = ppVar3->first + -1;
    for (local_c8 = 1; local_c8 <= (ulong)(long)local_b4; local_c8 = local_c8 + 1) {
      local_cc = (value_type_conflict1)local_c8;
      pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &numbers._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_cc);
      plane_surface_it_end._M_node = (_Base_ptr)pVar4.first._M_node;
    }
  }
  __x = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                  (&this->plane_surfaces_map);
  local_f8._M_node =
       (_Base_ptr)std::prev<std::_Rb_tree_iterator<std::pair<int_const,int>>>(__x._M_node,1);
  look_ahead._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 (&this->plane_surfaces_map);
  while (bVar2 = std::operator!=(&look_ahead,&local_f8), bVar2) {
    p_Stack_118 = look_ahead._M_node;
    local_110 = std::next<std::_Rb_tree_iterator<std::pair<int_const,int>>>(look_ahead,1);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&look_ahead);
    local_11c = ppVar3->first;
    while( true ) {
      local_11c = local_11c + 1;
      iVar1 = local_11c;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_110);
      if (ppVar3->first <= iVar1) break;
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 &numbers._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_11c);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&look_ahead,0);
  }
  bVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     &numbers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar2) {
    this_local._4_4_ = 0;
  }
  else {
    pl_sur_it_1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  end(&this->plane_surfaces_map);
    local_f8._M_node = pl_sur_it_1._M_node;
    local_148._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                   (&this->plane_surfaces_map);
    while (bVar2 = std::operator!=(&local_148,&local_f8), bVar2) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_148);
      pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &changes._M_t._M_impl.super__Rb_tree_header._M_node_count,&ppVar3->first);
      local_158 = (_Base_ptr)pVar4.first._M_node;
      local_150 = pVar4.second;
      local_160 = (_Base_ptr)
                  std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&local_148,0);
    }
    perform_shift(this,(set<int,_std::less<int>,_std::allocator<int>_> *)
                       &numbers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (set<int,_std::less<int>,_std::allocator<int>_> *)
                  &changes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  local_a8);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              (&local_190,
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               local_a8);
    this_local._4_4_ = adjust_plane_surfaces(this,&local_190);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              (&local_190);
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_a8)
  ;
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &changes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &numbers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this_local._4_4_;
}

Assistant:

int GEO::geofile::simplify_plane_surfaces()
{
    std::set<int>       gaps;
    std::set<int>       numbers;
    std::map<int, int>  changes;
    // Store all gaps
    // before start
    if (plane_surfaces_map.begin()->first>1)
    {
        int total_pre_gaps = plane_surfaces_map.begin()->first - 1;
        for (size_t i = 1; i <= total_pre_gaps; i++)
        {
            gaps.insert(i);
        }
    }
    // after start
    auto plane_surface_it_end   = std::prev(plane_surfaces_map.end(),1);
    for (auto pl_sur_it = plane_surfaces_map.begin(); pl_sur_it!=plane_surface_it_end; pl_sur_it++)
    {
        auto look_ahead = std::next(pl_sur_it,1);
        for (int i = pl_sur_it->first+1; i < look_ahead->first; i++)
        {
            gaps.insert(i);
        }
    }
    if (!gaps.empty())
    {
        // Store all non-gaps
        plane_surface_it_end = plane_surfaces_map.end();
        for (auto pl_sur_it = plane_surfaces_map.begin(); pl_sur_it != plane_surface_it_end; pl_sur_it++)
        {
            numbers.insert(pl_sur_it->first);
        }
        perform_shift(gaps, numbers, changes);
        return adjust_plane_surfaces(changes);
    }
    return EXIT_SUCCESS;
}